

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<64U,_24U,_buffer_layout_bfs>::operator()
          (fill<64U,_24U,_buffer_layout_bfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  size_t from0;
  int iVar1;
  reference pvVar2;
  value_type_conflict1 vVar3;
  uchar **ppuVar4;
  array<unsigned_long,_64UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_64UL> *streams_local;
  fill<64U,_24U,_buffer_layout_bfs> *this_local;
  uchar **resultbuf_2;
  uchar **l_1;
  size_t lcount_1;
  uchar **newbegin_1;
  uchar **begin_1;
  uchar **local_a0;
  uchar **resultbuf_1;
  uchar **r_1;
  size_t rcount_1;
  uchar **newbegin;
  uchar **begin;
  uchar **local_70;
  uchar **resultbuf;
  uchar **r;
  uchar **l;
  size_t rcount;
  size_t lcount;
  long local_40;
  size_t need;
  uchar **local_30;
  array<Stream,_64UL> *local_28;
  
  local_40 = 8;
  need = (size_t)buffer_count;
  local_30 = buffer;
  local_28 = streams;
  do {
    pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x30);
    if (*pvVar2 == 0) {
      fill<64U,_48U,_buffer_layout_bfs>::operator()
                ((fill<64U,_48U,_buffer_layout_bfs> *)((long)&lcount + 7),local_28,local_30,
                 (array<unsigned_long,_64UL> *)need);
      pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x30);
      if (*pvVar2 == 0) {
        do {
          pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                             ((array<unsigned_long,_64UL> *)need,0x31);
          if (*pvVar2 == 0) {
            fill<64U,_49U,_buffer_layout_bfs>::operator()
                      ((fill<64U,_49U,_buffer_layout_bfs> *)((long)&begin + 7),local_28,local_30,
                       (array<unsigned_long,_64UL> *)need);
            pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                               ((array<unsigned_long,_64UL> *)need,0x31);
            if (*pvVar2 == 0) {
              newbegin = local_30 + 0x10ac;
              rcount_1 = (size_t)(local_30 + local_40 + 0x10ac);
              memmove((void *)rcount_1,newbegin,(8 - local_40) * 8);
              vVar3 = 8 - local_40;
              pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                                 ((array<unsigned_long,_64UL> *)need,0x18);
              from0 = rcount_1;
              *pvVar2 = vVar3;
              pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                                 ((array<unsigned_long,_64UL> *)need,0x18);
              check_input((uchar **)from0,*pvVar2);
              return;
            }
          }
          pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                             ((array<unsigned_long,_64UL> *)need,0x31);
          r_1 = (uchar **)*pvVar2;
          resultbuf_1 = local_30 + (0x128a - (long)r_1);
          local_a0 = local_30 + (0x10b4 - local_40);
          *local_a0 = *resultbuf_1;
          pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                             ((array<unsigned_long,_64UL> *)need,0x31);
          *pvVar2 = *pvVar2 - 1;
          local_40 = local_40 + -1;
        } while (local_40 != 0);
        pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                           ((array<unsigned_long,_64UL> *)need,0x18);
        *pvVar2 = 8;
        ppuVar4 = local_30 + 0x10ac;
        pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                           ((array<unsigned_long,_64UL> *)need,0x18);
        check_input(ppuVar4,*pvVar2);
        return;
      }
    }
    pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x31);
    if (*pvVar2 == 0) {
      fill<64U,_49U,_buffer_layout_bfs>::operator()
                ((fill<64U,_49U,_buffer_layout_bfs> *)((long)&lcount + 6),local_28,local_30,
                 (array<unsigned_long,_64UL> *)need);
      pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x31);
      if (*pvVar2 == 0) {
        do {
          pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                             ((array<unsigned_long,_64UL> *)need,0x30);
          if (*pvVar2 == 0) {
            fill<64U,_48U,_buffer_layout_bfs>::operator()
                      ((fill<64U,_48U,_buffer_layout_bfs> *)((long)&begin_1 + 7),local_28,local_30,
                       (array<unsigned_long,_64UL> *)need);
            pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                               ((array<unsigned_long,_64UL> *)need,0x30);
            if (*pvVar2 == 0) {
              ppuVar4 = local_30 + local_40 + 0x10ac;
              memmove(ppuVar4,local_30 + 0x10ac,(8 - local_40) * 8);
              vVar3 = 8 - local_40;
              pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                                 ((array<unsigned_long,_64UL> *)need,0x18);
              *pvVar2 = vVar3;
              pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                                 ((array<unsigned_long,_64UL> *)need,0x18);
              check_input(ppuVar4,*pvVar2);
              return;
            }
          }
          pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                             ((array<unsigned_long,_64UL> *)need,0x30);
          local_30[0x10b4 - local_40] = local_30[0x1273 - *pvVar2];
          pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                             ((array<unsigned_long,_64UL> *)need,0x30);
          *pvVar2 = *pvVar2 - 1;
          local_40 = local_40 + -1;
        } while (local_40 != 0);
        pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                           ((array<unsigned_long,_64UL> *)need,0x18);
        *pvVar2 = 8;
        ppuVar4 = local_30 + 0x10ac;
        pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                           ((array<unsigned_long,_64UL> *)need,0x18);
        check_input(ppuVar4,*pvVar2);
        return;
      }
    }
    pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x30);
    rcount = *pvVar2;
    pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x31);
    l = (uchar **)*pvVar2;
    r = local_30 + (0x1273 - rcount);
    resultbuf = local_30 + (0x128a - (long)l);
    local_70 = local_30 + (0x10b4 - local_40);
    iVar1 = cmp(*r,*resultbuf);
    if (iVar1 < 1) {
      *local_70 = *r;
      pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x30);
      *pvVar2 = *pvVar2 - 1;
    }
    else {
      *local_70 = *resultbuf;
      pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x31);
      *pvVar2 = *pvVar2 - 1;
    }
    check_input(local_30 + 0x10ac,8 - local_40);
    local_40 = local_40 + -1;
  } while (local_40 != 0);
  pvVar2 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)need,0x18);
  *pvVar2 = 8;
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}